

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

Var __thiscall Minisat::Solver::newVar(Solver *this,lbool upol,bool dvar)

{
  int iVar1;
  int key;
  double dVar2;
  int local_30;
  int local_2c;
  
  iVar1 = (this->free_vars).sz;
  if ((long)iVar1 < 1) {
    key = this->next_var;
    this->next_var = key + 1;
  }
  else {
    key = (this->free_vars).data[(long)iVar1 + -1];
    (this->free_vars).sz = iVar1 + -1;
  }
  local_2c = key * 2;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::init(&this->watches,(EVP_PKEY_CTX *)&local_2c);
  local_30 = key * 2 + 1;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::init(&this->watches,(EVP_PKEY_CTX *)&local_30);
  IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>,key,
             l_Undef);
  IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->vardata).
              super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>,key,
             (VarData)0xffffffff);
  dVar2 = 0.0;
  if (this->rnd_init_act == true) {
    dVar2 = this->random_seed * 1389796.0;
    dVar2 = dVar2 - (double)(int)(dVar2 / 2147483647.0) * 2147483647.0;
    this->random_seed = dVar2;
    dVar2 = (dVar2 / 2147483647.0) * 1e-05;
  }
  IntMap<int,_double,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>,key,dVar2);
  IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,key,'\0');
  IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,key,'\x01');
  IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->user_pol).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>,key,
             upol);
  vec<char,_int>::growTo((vec<char,_int> *)&this->decision,key + 1);
  vec<Minisat::Lit,_int>::capacity(&this->trail,key + 1);
  setDecisionVar(this,key,dvar);
  return key;
}

Assistant:

Var Solver::newVar(lbool upol, bool dvar)
{
    Var v;
    if (free_vars.size() > 0){
        v = free_vars.last();
        free_vars.pop();
    }else
        v = next_var++;

    watches  .init(mkLit(v, false));
    watches  .init(mkLit(v, true ));
    assigns  .insert(v, l_Undef);
    vardata  .insert(v, mkVarData(CRef_Undef, 0));
    activity .insert(v, rnd_init_act ? drand(random_seed) * 0.00001 : 0);
    seen     .insert(v, 0);
    polarity .insert(v, true);
    user_pol .insert(v, upol);
    decision .reserve(v);
    trail    .capacity(v+1);
    setDecisionVar(v, dvar);
    return v;
}